

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O2

void __thiscall
DisconnectedBlockTransactions::~DisconnectedBlockTransactions(DisconnectedBlockTransactions *this)

{
  long lVar1;
  uint __line;
  char *__assertion;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->queuedTx).
      super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->queuedTx) {
    if ((this->iters_by_txid)._M_h._M_element_count == 0) {
      if (this->cachedInnerUsage == 0) {
        std::
        _Hashtable<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&(this->iters_by_txid)._M_h);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__cxx11::
          _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::_M_clear(&(this->queuedTx).
                      super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    );
          return;
        }
        __stack_chk_fail();
      }
      __assertion = "cachedInnerUsage == 0";
      __line = 0x1c;
    }
    else {
      __assertion = "iters_by_txid.empty()";
      __line = 0x1b;
    }
  }
  else {
    __assertion = "queuedTx.empty()";
    __line = 0x1a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/disconnected_transactions.cpp"
                ,__line,"DisconnectedBlockTransactions::~DisconnectedBlockTransactions()");
}

Assistant:

DisconnectedBlockTransactions::~DisconnectedBlockTransactions()
{
    assert(queuedTx.empty());
    assert(iters_by_txid.empty());
    assert(cachedInnerUsage == 0);
}